

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

Result __thiscall wabt::interp::Table::Fill(Table *this,Store *store,u32 offset,Ref ref,u32 size)

{
  pointer pRVar1;
  bool bVar2;
  Enum EVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  
  bVar2 = Store::HasValueType(store,ref,*(ValueType *)&(this->type_).super_ExternType.field_0xc);
  if (!bVar2) {
    __assert_fail("store.HasValueType(ref, type_.element)",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/interp/interp.cc"
                  ,0x216,"Result wabt::interp::Table::Fill(Store &, u32, Ref, u32)");
  }
  pRVar1 = (this->elements_).
           super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = (long)(this->elements_).
                super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pRVar1 >> 3;
  uVar5 = (ulong)size;
  EVar3 = Error;
  if ((ulong)offset <= uVar4 - uVar5 && uVar5 <= uVar4) {
    if (size == 0) {
      EVar3 = Ok;
    }
    else {
      EVar3 = Ok;
      lVar6 = 0;
      do {
        *(size_t *)((long)&pRVar1[offset].index + lVar6) = ref.index;
        lVar6 = lVar6 + 8;
      } while (uVar5 << 3 != lVar6);
    }
  }
  return (Result)EVar3;
}

Assistant:

Result Table::Fill(Store& store, u32 offset, Ref ref, u32 size) {
  assert(store.HasValueType(ref, type_.element));
  if (IsValidRange(offset, size)) {
    std::fill(elements_.begin() + offset, elements_.begin() + offset + size,
              ref);
    return Result::Ok;
  }
  return Result::Error;
}